

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O3

REF_STATUS ref_clump_between(REF_GRID_conflict ref_grid,REF_INT node0,REF_INT node1,char *filename)

{
  REF_CELL pRVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  FILE *__s;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  REF_INT RVar8;
  long lVar9;
  REF_DICT node_dict;
  REF_DICT tet_dict;
  REF_DICT tri_dict;
  REF_INT nodes [27];
  long local_e0;
  int local_d8;
  REF_DICT local_c8;
  REF_DICT local_c0;
  REF_DICT local_b8;
  REF_DICT local_b0;
  REF_INT local_a8 [30];
  
  uVar4 = ref_dict_create(&local_c8);
  if (uVar4 == 0) {
    uVar4 = ref_dict_create(&local_b0);
    if (uVar4 == 0) {
      uVar4 = ref_dict_create(&local_b8);
      if (uVar4 == 0) {
        pRVar1 = ref_grid->cell[3];
        local_c0 = local_b0;
        if (((node0 < 0) || (pRVar2 = pRVar1->ref_adj, pRVar2->nnode <= node0)) ||
           (lVar5 = (long)pRVar2->first[(uint)node0], lVar5 == -1)) {
LAB_001f13f1:
          if (((node1 < 0) || (pRVar2 = pRVar1->ref_adj, pRVar2->nnode <= node1)) ||
             (lVar5 = (long)pRVar2->first[(uint)node1], lVar5 == -1)) {
LAB_001f1522:
            pRVar1 = ref_grid->cell[8];
            local_c0 = local_b8;
            if (((node0 < 0) || (pRVar2 = pRVar1->ref_adj, pRVar2->nnode <= node0)) ||
               (lVar5 = (long)pRVar2->first[(uint)node0], lVar5 == -1)) {
LAB_001f165e:
              if (((node1 < 0) || (pRVar2 = pRVar1->ref_adj, pRVar2->nnode <= node1)) ||
                 (local_e0 = (long)pRVar2->first[(uint)node1], local_e0 == -1)) {
LAB_001f1726:
                __s = fopen(filename,"w");
                if (__s == (FILE *)0x0) {
                  printf("unable to open %s\n",filename);
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                         ,0xe6,"ref_clump_between","unable to open file");
                  return 2;
                }
                fwrite("title=\"tecplot refine clump file\"\n",0x22,1,__s);
                fwrite("variables = \"x\" \"y\" \"z\" \"xm\" \"ym\" \"zm\" \"g\"\n",0x2b,1,__s);
                uVar4 = ref_clump_zone_around
                                  ((FILE *)__s,ref_grid->cell[3],local_b0,"fetriangle",local_c8,
                                   ref_grid->node,node0);
                if (uVar4 == 0) {
                  uVar4 = ref_clump_zone_around
                                    ((FILE *)__s,ref_grid->cell[8],local_b8,"fetetrahedron",local_c8
                                     ,ref_grid->node,node0);
                  if (uVar4 == 0) {
                    fclose(__s);
                    uVar4 = ref_dict_free(local_b8);
                    if (uVar4 == 0) {
                      uVar4 = ref_dict_free(local_b0);
                      if (uVar4 == 0) {
                        uVar4 = ref_dict_free(local_c8);
                        if (uVar4 == 0) {
                          return 0;
                        }
                        pcVar7 = "free nodes";
                        uVar6 = 0xfd;
                      }
                      else {
                        pcVar7 = "free tris";
                        uVar6 = 0xfc;
                      }
                    }
                    else {
                      pcVar7 = "free tet";
                      uVar6 = 0xfb;
                    }
                  }
                  else {
                    pcVar7 = "zone";
                    uVar6 = 0xf7;
                  }
                }
                else {
                  pcVar7 = "zone";
                  uVar6 = 0xf0;
                }
              }
              else {
                RVar8 = pRVar2->item[local_e0].ref;
                while (uVar4 = ref_cell_nodes(pRVar1,RVar8,local_a8), uVar4 == 0) {
                  uVar4 = ref_dict_store(local_c0,RVar8,0);
                  if (uVar4 != 0) {
                    pcVar7 = "store";
                    uVar6 = 0xdf;
                    goto LAB_001f12bf;
                  }
                  if (0 < pRVar1->node_per) {
                    lVar5 = 0;
                    do {
                      uVar4 = ref_dict_store(local_c8,local_a8[lVar5],0);
                      if (uVar4 != 0) {
                        pcVar7 = "store";
                        uVar6 = 0xe1;
                        goto LAB_001f12bf;
                      }
                      lVar5 = lVar5 + 1;
                    } while (lVar5 < pRVar1->node_per);
                  }
                  pRVar3 = pRVar1->ref_adj->item;
                  local_e0 = (long)pRVar3[(int)local_e0].next;
                  if (local_e0 == -1) goto LAB_001f1726;
                  RVar8 = pRVar3[local_e0].ref;
                }
                pcVar7 = "n";
                uVar6 = 0xde;
              }
            }
            else {
              RVar8 = pRVar2->item[lVar5].ref;
              uVar4 = ref_cell_nodes(pRVar1,RVar8,local_a8);
              while (uVar4 == 0) {
                uVar4 = ref_dict_store(local_c0,RVar8,0);
                if (uVar4 != 0) {
                  pcVar7 = "store";
                  uVar6 = 0xd9;
                  goto LAB_001f12bf;
                }
                if (0 < pRVar1->node_per) {
                  lVar9 = 0;
                  do {
                    uVar4 = ref_dict_store(local_c8,local_a8[lVar9],0);
                    if (uVar4 != 0) {
                      pcVar7 = "store";
                      uVar6 = 0xdb;
                      goto LAB_001f12bf;
                    }
                    lVar9 = lVar9 + 1;
                  } while (lVar9 < pRVar1->node_per);
                }
                pRVar3 = pRVar1->ref_adj->item;
                local_d8 = (int)lVar5;
                lVar5 = (long)pRVar3[local_d8].next;
                if (lVar5 == -1) goto LAB_001f165e;
                RVar8 = pRVar3[lVar5].ref;
                uVar4 = ref_cell_nodes(pRVar1,RVar8,local_a8);
              }
              pcVar7 = "n";
              uVar6 = 0xd8;
            }
          }
          else {
            RVar8 = pRVar2->item[lVar5].ref;
            uVar4 = ref_cell_nodes(pRVar1,RVar8,local_a8);
            while (uVar4 == 0) {
              uVar4 = ref_dict_store(local_c0,RVar8,0);
              if (uVar4 != 0) {
                pcVar7 = "store";
                uVar6 = 0xd1;
                goto LAB_001f12bf;
              }
              if (0 < pRVar1->node_per) {
                lVar9 = 0;
                do {
                  uVar4 = ref_dict_store(local_c8,local_a8[lVar9],0);
                  if (uVar4 != 0) {
                    pcVar7 = "store";
                    uVar6 = 0xd3;
                    goto LAB_001f12bf;
                  }
                  lVar9 = lVar9 + 1;
                } while (lVar9 < pRVar1->node_per);
              }
              pRVar3 = pRVar1->ref_adj->item;
              local_d8 = (int)lVar5;
              lVar5 = (long)pRVar3[local_d8].next;
              if (lVar5 == -1) goto LAB_001f1522;
              RVar8 = pRVar3[lVar5].ref;
              uVar4 = ref_cell_nodes(pRVar1,RVar8,local_a8);
            }
            pcVar7 = "n";
            uVar6 = 0xd0;
          }
        }
        else {
          RVar8 = pRVar2->item[lVar5].ref;
          uVar4 = ref_cell_nodes(pRVar1,RVar8,local_a8);
          while (uVar4 == 0) {
            uVar4 = ref_dict_store(local_c0,RVar8,0);
            if (uVar4 != 0) {
              pcVar7 = "store";
              uVar6 = 0xcb;
              goto LAB_001f12bf;
            }
            if (0 < pRVar1->node_per) {
              lVar9 = 0;
              do {
                uVar4 = ref_dict_store(local_c8,local_a8[lVar9],0);
                if (uVar4 != 0) {
                  pcVar7 = "store";
                  uVar6 = 0xcd;
                  goto LAB_001f12bf;
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 < pRVar1->node_per);
            }
            pRVar3 = pRVar1->ref_adj->item;
            local_d8 = (int)lVar5;
            lVar5 = (long)pRVar3[local_d8].next;
            if (lVar5 == -1) goto LAB_001f13f1;
            RVar8 = pRVar3[lVar5].ref;
            uVar4 = ref_cell_nodes(pRVar1,RVar8,local_a8);
          }
          pcVar7 = "n";
          uVar6 = 0xca;
        }
      }
      else {
        pcVar7 = "create tets";
        uVar6 = 0xc5;
      }
    }
    else {
      pcVar7 = "create tris";
      uVar6 = 0xc4;
    }
  }
  else {
    pcVar7 = "create nodes";
    uVar6 = 0xc3;
  }
LAB_001f12bf:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar6,
         "ref_clump_between",(ulong)uVar4,pcVar7);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_clump_between(REF_GRID ref_grid, REF_INT node0,
                                     REF_INT node1, const char *filename) {
  REF_DICT node_dict, tri_dict, tet_dict;
  REF_DICT ref_dict;
  REF_CELL ref_cell;
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  const char *zonetype;

  FILE *f;

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&tri_dict), "create tris");
  RSS(ref_dict_create(&tet_dict), "create tets");

  ref_cell = ref_grid_tri(ref_grid);
  ref_dict = tri_dict;
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  ref_cell = ref_grid_tet(ref_grid);
  ref_dict = tet_dict;
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine clump file\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\" \"xm\" \"ym\" \"zm\" \"g\"\n");

  ref_cell = ref_grid_tri(ref_grid);
  ref_dict = tri_dict;
  zonetype = "fetriangle";
  RSS(ref_clump_zone_around(f, ref_cell, ref_dict, zonetype, node_dict,
                            ref_grid_node(ref_grid), node0),
      "zone");

  ref_cell = ref_grid_tet(ref_grid);
  ref_dict = tet_dict;
  zonetype = "fetetrahedron";
  RSS(ref_clump_zone_around(f, ref_cell, ref_dict, zonetype, node_dict,
                            ref_grid_node(ref_grid), node0),
      "zone");

  fclose(f);

  RSS(ref_dict_free(tet_dict), "free tet");
  RSS(ref_dict_free(tri_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  return REF_SUCCESS;
}